

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O3

void __thiscall Assimp::D3MF::D3MFExporter::writeFaces(D3MFExporter *this,aiMesh *mesh,uint matIdx)

{
  long lVar1;
  char cVar2;
  ostream *poVar3;
  long *plVar4;
  long *plVar5;
  ostringstream *poVar6;
  ulong uVar7;
  long *local_218;
  long local_208;
  long lStack_200;
  aiMesh *local_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  ulong local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (((mesh != (aiMesh *)0x0) && (mesh->mFaces != (aiFace *)0x0)) && (mesh->mNumFaces != 0)) {
    poVar6 = &this->mModelOutput;
    local_1f8 = mesh;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"<",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar6,XmlTag::triangles_abi_cxx11_,DAT_008dd938);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    cVar2 = (char)poVar6;
    if (local_1f8->mNumFaces != 0) {
      local_1d0 = (ulong)matIdx;
      uVar7 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"<",1);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar6,XmlTag::triangle_abi_cxx11_,DAT_008dd958);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," v1=\"",5);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" v2=\"",6);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" v3=\"",6);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x6b56c9);
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_1e0 = *plVar5;
          lStack_1d8 = plVar4[3];
          local_1f0 = &local_1e0;
        }
        else {
          local_1e0 = *plVar5;
          local_1f0 = (long *)*plVar4;
        }
        local_1e8 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f0);
        local_218 = &local_208;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_208 = *plVar5;
          lStack_200 = plVar4[3];
        }
        else {
          local_208 = *plVar5;
          local_218 = (long *)*plVar4;
        }
        lVar1 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_218,lVar1);
        if (local_218 != &local_208) {
          operator_delete(local_218,local_208 + 1);
        }
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0,local_1e0 + 1);
        }
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],local_1b8[0] + 1);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_1f8->mNumFaces);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"</",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar6,XmlTag::triangles_abi_cxx11_,DAT_008dd938);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  return;
}

Assistant:

void D3MFExporter::writeFaces( aiMesh *mesh, unsigned int matIdx ) {
    if ( nullptr == mesh ) {
        return;
    }

    if ( !mesh->HasFaces() ) {
        return;
    }
    mModelOutput << "<" << XmlTag::triangles << ">" << std::endl;
    for ( unsigned int i = 0; i < mesh->mNumFaces; ++i ) {
        aiFace &currentFace = mesh->mFaces[ i ];
        mModelOutput << "<" << XmlTag::triangle << " v1=\"" << currentFace.mIndices[ 0 ] << "\" v2=\""
                << currentFace.mIndices[ 1 ] << "\" v3=\"" << currentFace.mIndices[ 2 ]
                << "\" pid=\"1\" p1=\""+to_string(matIdx)+"\" />";
        mModelOutput << std::endl;
    }
    mModelOutput << "</" << XmlTag::triangles << ">";
    mModelOutput << std::endl;
}